

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SpvBuilder.cpp
# Opt level: O0

Id __thiscall
spv::Builder::createTextureQueryCall
          (Builder *this,Op opCode,TextureParameters *parameters,bool isUnsignedResult)

{
  bool bVar1;
  Dim DVar2;
  Id IVar3;
  Instruction *this_00;
  Id local_5c;
  Id local_58;
  unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_> local_40;
  Instruction *local_38;
  Instruction *query;
  Id intType;
  int numComponents;
  Id resultType;
  bool isUnsignedResult_local;
  TextureParameters *parameters_local;
  Builder *pBStack_10;
  Op opCode_local;
  Builder *this_local;
  
  intType = 0;
  numComponents._3_1_ = isUnsignedResult;
  _resultType = parameters;
  parameters_local._4_4_ = opCode;
  pBStack_10 = this;
  if (1 < opCode - OpImageQuerySizeLod) {
    if (opCode == OpImageQueryLod) {
      IVar3 = getTypeId(this,parameters->coords);
      IVar3 = getScalarTypeId(this,IVar3);
      intType = makeVectorType(this,IVar3,2);
    }
    else {
      if (1 < opCode - OpImageQueryLevels) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                      ,0xd2e,
                      "Id spv::Builder::createTextureQueryCall(Op, const TextureParameters &, bool)"
                     );
      }
      if (isUnsignedResult) {
        local_5c = makeUintType(this,0x20);
      }
      else {
        local_5c = makeIntType(this,0x20);
      }
      intType = local_5c;
    }
    goto LAB_0060e485;
  }
  query._4_4_ = 0;
  IVar3 = getImageType(this,parameters->sampler);
  DVar2 = getTypeDimensionality(this,IVar3);
  if (DVar2 == Dim1D) {
LAB_0060e34c:
    query._4_4_ = 1;
  }
  else {
    if (DVar2 != Dim2D) {
      if (DVar2 == Dim3D) {
        query._4_4_ = 3;
        goto LAB_0060e386;
      }
      if (1 < DVar2 - Cube) {
        if (DVar2 == Buffer) goto LAB_0060e34c;
        if (DVar2 != DimSubpassData) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/ThirdParty/glslang/SPIRV/SpvBuilder.cpp"
                        ,0xd18,
                        "Id spv::Builder::createTextureQueryCall(Op, const TextureParameters &, bool)"
                       );
        }
      }
    }
    query._4_4_ = 2;
  }
LAB_0060e386:
  IVar3 = getImageType(this,_resultType->sampler);
  bVar1 = isArrayedImageType(this,IVar3);
  if (bVar1) {
    query._4_4_ = query._4_4_ + 1;
  }
  if ((numComponents._3_1_ & 1) == 0) {
    local_58 = makeIntType(this,0x20);
  }
  else {
    local_58 = makeUintType(this,0x20);
  }
  query._0_4_ = local_58;
  if (query._4_4_ == 1) {
    intType = local_58;
  }
  else {
    intType = makeVectorType(this,local_58,query._4_4_);
  }
LAB_0060e485:
  this_00 = (Instruction *)::operator_new(0x60);
  IVar3 = getUniqueId(this);
  spv::Instruction::Instruction(this_00,IVar3,intType,parameters_local._4_4_);
  local_38 = this_00;
  spv::Instruction::addIdOperand(this_00,_resultType->sampler);
  if (_resultType->coords != 0) {
    spv::Instruction::addIdOperand(local_38,_resultType->coords);
  }
  if (_resultType->lod != 0) {
    spv::Instruction::addIdOperand(local_38,_resultType->lod);
  }
  std::unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>>::
  unique_ptr<std::default_delete<spv::Instruction>,void>
            ((unique_ptr<spv::Instruction,std::default_delete<spv::Instruction>> *)&local_40,
             local_38);
  addInstruction(this,&local_40);
  std::unique_ptr<spv::Instruction,_std::default_delete<spv::Instruction>_>::~unique_ptr(&local_40);
  addCapability(this,CapabilityImageQuery);
  IVar3 = spv::Instruction::getResultId(local_38);
  return IVar3;
}

Assistant:

Id Builder::createTextureQueryCall(Op opCode, const TextureParameters& parameters, bool isUnsignedResult)
{
    // Figure out the result type
    Id resultType = 0;
    switch (opCode) {
    case OpImageQuerySize:
    case OpImageQuerySizeLod:
    {
        int numComponents = 0;
        switch (getTypeDimensionality(getImageType(parameters.sampler))) {
        case Dim1D:
        case DimBuffer:
            numComponents = 1;
            break;
        case Dim2D:
        case DimCube:
        case DimRect:
        case DimSubpassData:
            numComponents = 2;
            break;
        case Dim3D:
            numComponents = 3;
            break;

        default:
            assert(0);
            break;
        }
        if (isArrayedImageType(getImageType(parameters.sampler)))
            ++numComponents;

        Id intType = isUnsignedResult ? makeUintType(32) : makeIntType(32);
        if (numComponents == 1)
            resultType = intType;
        else
            resultType = makeVectorType(intType, numComponents);

        break;
    }
    case OpImageQueryLod:
        resultType = makeVectorType(getScalarTypeId(getTypeId(parameters.coords)), 2);
        break;
    case OpImageQueryLevels:
    case OpImageQuerySamples:
        resultType = isUnsignedResult ? makeUintType(32) : makeIntType(32);
        break;
    default:
        assert(0);
        break;
    }

    Instruction* query = new Instruction(getUniqueId(), resultType, opCode);
    query->addIdOperand(parameters.sampler);
    if (parameters.coords)
        query->addIdOperand(parameters.coords);
    if (parameters.lod)
        query->addIdOperand(parameters.lod);
    addInstruction(std::unique_ptr<Instruction>(query));
    addCapability(CapabilityImageQuery);

    return query->getResultId();
}